

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCommunicationsNode.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IOCommunicationsNode::Encode(IOCommunicationsNode *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  IOCommunicationsNode *this_local;
  
  StandardVariable::Encode(&this->super_StandardVariable,stream);
  pKVar1 = KDataStream::operator<<(stream,(this->super_StandardVariable).field_0xe);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_StandardVariable).field_0xf);
  DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_CommID);
  return;
}

Assistant:

void IOCommunicationsNode::Encode( KDataStream & stream ) const
{
    StandardVariable::Encode( stream );

    stream << m_ui8CommNodeTyp
           << m_ui8Padding
           << KDIS_STREAM m_CommID;
}